

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuFloat.hpp
# Opt level: O2

Float<unsigned_int,_8,_23,_127,_3U>
tcu::Float<unsigned_int,8,23,127,3u>::convert<unsigned_short,5,10,15,3u>
          (Float<unsigned_short,_5,_10,_15,_3U> *other)

{
  ushort uVar1;
  StorageType SVar2;
  uint uVar3;
  uint uVar4;
  ulong uVar5;
  uint uVar6;
  
  uVar1 = other->m_value;
  if ((uVar1 & 0x7fff) != 0x7c00) {
    if ((~uVar1 & 0x7c00) == 0 && (uVar1 & 0x3ff) != 0) {
      return (Float<unsigned_int,_8,_23,_127,_3U>)0x7fffffff;
    }
    if ((uVar1 & 0x7fff) == 0) {
      return (Float<unsigned_int,_8,_23,_127,_3U>)((uint)uVar1 << 0x10);
    }
    uVar3 = Float<unsigned_short,_5,_10,_15,_3U>::exponent(other);
    SVar2 = Float<unsigned_short,_5,_10,_15,_3U>::mantissa(other);
    uVar4 = uVar3 * 0x800000 + 0x3f800000;
    for (uVar5 = (ulong)SVar2; ((uint)uVar5 >> 10 & 1) == 0; uVar5 = uVar5 * 2) {
      uVar3 = uVar3 - 1;
      uVar4 = uVar4 - 0x800000;
    }
    uVar6 = (uint)(uVar1 >> 0xf) << 0x1f;
    if ((int)uVar3 < -0x7e) {
      if (0xffffff69 < uVar3) {
        return (Float<unsigned_int,_8,_23,_127,_3U>)
               (uVar6 | (uint)(~(-1L << (0x74U - (char)uVar3 & 0x3f)) + uVar5 +
                               (ulong)((uVar5 >> ((ulong)(-uVar3 - 0x8b) & 0x3f) & 1) != 0) >>
                              ((byte)(-uVar3 - 0x8b) & 0x3f)));
      }
      return (Float<unsigned_int,_8,_23,_127,_3U>)((other->m_value & 0x8000) << 0x10);
    }
    if ((int)uVar3 < 0x80) {
      return (Float<unsigned_int,_8,_23,_127,_3U>)(uVar4 | uVar6 | ((uint)uVar5 & 0x7fbff) << 0xd);
    }
    uVar1 = other->m_value;
  }
  return (Float<unsigned_int,_8,_23,_127,_3U>)((uint)(-1 < (short)uVar1) * -0x80000000 - 0x800000);
}

Assistant:

inline int				sign			(void) const	{ return signBit() ? -1 : 1;																			}